

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O0

void __thiscall fineftp::FtpSession::handleFtpCommandCDUP(FtpSession *this,string *param_1)

{
  bool bVar1;
  Permission PVar2;
  FtpReplyCode FVar3;
  element_type *peVar4;
  allocator local_111;
  string local_110 [36];
  undefined4 local_ec;
  undefined1 local_e8 [40];
  string local_c0 [32];
  undefined1 local_a0 [8];
  FtpMessage cwd_reply;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  string *local_18;
  string *param_1_local;
  FtpSession *this_local;
  
  local_18 = param_1;
  param_1_local = (string *)this;
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->logged_in_user_);
  if (bVar1) {
    peVar4 = ::std::__shared_ptr_access<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->logged_in_user_);
    PVar2 = operator&(peVar4->permissions_,DirList);
    if (PVar2 == None) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_70,"Permission denied",(allocator *)&cwd_reply.field_0x27);
      sendFtpMessage(this,ACTION_NOT_TAKEN,(string *)local_70);
      ::std::__cxx11::string::~string(local_70);
      ::std::allocator<char>::~allocator((allocator<char> *)&cwd_reply.field_0x27);
    }
    else {
      bVar1 = ::std::operator!=(&this->ftp_working_directory_,"/");
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_c0,"..",(allocator *)(local_e8 + 0x27));
        executeCWD((FtpMessage *)local_a0,this,(string *)local_c0);
        ::std::__cxx11::string::~string(local_c0);
        ::std::allocator<char>::~allocator((allocator<char> *)(local_e8 + 0x27));
        FVar3 = FtpMessage::replyCode((FtpMessage *)local_a0);
        if (FVar3 == FILE_ACTION_COMPLETED) {
          FtpMessage::message_abi_cxx11_((FtpMessage *)local_e8);
          sendFtpMessage(this,COMMAND_OK,(string *)local_e8);
          ::std::__cxx11::string::~string((string *)local_e8);
        }
        else {
          sendFtpMessage(this,(FtpMessage *)local_a0);
        }
        local_ec = 1;
        FtpMessage::~FtpMessage((FtpMessage *)local_a0);
      }
      else {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_110,"Already at root directory",&local_111);
        sendFtpMessage(this,ACTION_NOT_TAKEN,(string *)local_110);
        ::std::__cxx11::string::~string(local_110);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_111);
      }
    }
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_38,"Not logged in",&local_39);
    sendFtpMessage(this,NOT_LOGGED_IN,(string *)local_38);
    ::std::__cxx11::string::~string(local_38);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return;
}

Assistant:

void FtpSession::handleFtpCommandCDUP(const std::string& /*param*/)
  {
    if (!logged_in_user_)
    {
      sendFtpMessage(FtpReplyCode::NOT_LOGGED_IN,    "Not logged in");
      return;
    }
    if (static_cast<int>(logged_in_user_->permissions_ & Permission::DirList) == 0) 
    {
      sendFtpMessage(FtpReplyCode::ACTION_NOT_TAKEN, "Permission denied");
      return;
    }

    if (ftp_working_directory_ != "/")
    {
      // Only CDUP when we are not already at the root directory
      auto cwd_reply = executeCWD("..");
      if (cwd_reply.replyCode() == FtpReplyCode::FILE_ACTION_COMPLETED)
      {
        // The CWD returns FILE_ACTION_COMPLETED on success, while CDUP returns COMMAND_OK on success.
        sendFtpMessage(FtpReplyCode::COMMAND_OK, cwd_reply.message());
        return;
      }
      else
      {
        sendFtpMessage(cwd_reply);
        return;
      }
    }
    else
    {
      sendFtpMessage(FtpReplyCode::ACTION_NOT_TAKEN, "Already at root directory");
      return;
    }
  }